

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

iterator * __thiscall
tcb::unicode::detail::
unicode_view<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,___gnu_cxx::__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_char32_t,_char16_t>
::iterator::operator++(iterator *this)

{
  char32_t *pcVar1;
  byte bVar2;
  char32_t cVar3;
  char32_t cVar4;
  ulong uVar5;
  
  bVar2 = this->idx_ + 1;
  this->idx_ = bVar2;
  if (((this->next_chars_).size_ == (uint)bVar2) &&
     (pcVar1 = (this->first_)._M_current, pcVar1 != (this->last_)._M_current)) {
    (this->first_)._M_current = pcVar1 + 1;
    cVar3 = *pcVar1;
    cVar4 = L'\xffffffff';
    if ((cVar3 & 0x1ff800U) != 0xd800) {
      cVar4 = cVar3;
    }
    if (0x10ffff < (uint)cVar3) {
      cVar4 = L'\xffffffff';
    }
    if ((uint)cVar4 < 0x10000) {
      uVar5 = 0x100000000;
    }
    else {
      cVar3 = (uint)(cVar4 + L'\x00ff0000') >> 10 | 0xd800;
      uVar5 = (ulong)(uint)((cVar4 & 0x3ffU) << 0x10) | 0x2dc000000;
    }
    this->next_chars_ = (encoded_chars<char16_t>)((uint)(cVar3 & 0xffff) | uVar5);
    this->idx_ = '\0';
  }
  return this;
}

Assistant:

TCB_CONSTEXPR14 iterator& operator++()
        {
            if (++idx_ == next_chars_.size() && first_ != last_) {
                char32_t c = utf_traits<InCharT>::decode(first_, last_);
                next_chars_ = utf_traits<OutCharT>::encode(c);
                idx_ = 0;
            }
            return *this;
        }